

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

int Abc_SuppGenFindBest(Vec_Wrd_t *p,int nBits,int *pMerit)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int Counts [64];
  int local_128 [64];
  
  iVar3 = 0;
  memset(local_128,0,0x100);
  Abc_SuppGenProfile(p,nBits,local_128);
  if (1 < nBits) {
    iVar3 = 0;
    uVar2 = 1;
    do {
      iVar1 = (int)uVar2;
      if (local_128[uVar2] <= local_128[iVar3]) {
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)nBits != uVar2);
  }
  *pMerit = local_128[iVar3];
  return iVar3;
}

Assistant:

int Abc_SuppGenFindBest( Vec_Wrd_t * p, int nBits, int * pMerit )
{
    int k, kBest = 0, Counts[64] = {0};
    Abc_SuppGenProfile( p, nBits, Counts );
    for ( k = 1; k < nBits; k++ )
        if ( Counts[kBest] < Counts[k] )
            kBest = k;
    *pMerit = Counts[kBest];
    return kBest;
}